

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

void masked_variance(uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,int a_stride,uint8_t *b_ptr,
                    int b_stride,uint8_t *m_ptr,int m_stride,int width,int height,uint *sse,
                    int *sum_)

{
  undefined1 auVar1 [16];
  __m128i m;
  __m128i b;
  __m128i a;
  __m128i src;
  __m128i sum_sq;
  __m128i sum;
  int y;
  int x;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 local_88;
  undefined1 in_stack_ffffffffffffff88 [16];
  __m128i *in_stack_ffffffffffffff98;
  __m128i *in_stack_ffffffffffffffa0;
  __m128i *in_stack_ffffffffffffffa8;
  __m128i *in_stack_ffffffffffffffb0;
  
  for (local_fc = 0; local_fc < (int)a[0]; local_fc = local_fc + 1) {
    for (local_f8 = 0; local_f8 < (int)b[1]; local_f8 = local_f8 + 0x10) {
      accumulate_block(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                       ,in_stack_ffffffffffffff98,in_stack_ffffffffffffff88._8_8_,
                       in_stack_ffffffffffffff88._0_8_);
    }
  }
  auVar1 = phaddd(ZEXT816(0),ZEXT816(0));
  auVar1 = phaddd(auVar1,auVar1);
  *(int *)src[0] = auVar1._0_4_;
  local_88 = auVar1._4_4_;
  *(undefined4 *)a[1] = local_88;
  return;
}

Assistant:

static void masked_variance(const uint8_t *src_ptr, int src_stride,
                            const uint8_t *a_ptr, int a_stride,
                            const uint8_t *b_ptr, int b_stride,
                            const uint8_t *m_ptr, int m_stride, int width,
                            int height, unsigned int *sse, int *sum_) {
  int x, y;
  __m128i sum = _mm_setzero_si128(), sum_sq = _mm_setzero_si128();

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 16) {
      const __m128i src = _mm_loadu_si128((const __m128i *)&src_ptr[x]);
      const __m128i a = _mm_loadu_si128((const __m128i *)&a_ptr[x]);
      const __m128i b = _mm_loadu_si128((const __m128i *)&b_ptr[x]);
      const __m128i m = _mm_loadu_si128((const __m128i *)&m_ptr[x]);
      accumulate_block(&src, &a, &b, &m, &sum, &sum_sq);
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // Reduce down to a single sum and sum of squares
  sum = _mm_hadd_epi32(sum, sum_sq);
  sum = _mm_hadd_epi32(sum, sum);
  *sum_ = _mm_cvtsi128_si32(sum);
  *sse = (unsigned int)_mm_cvtsi128_si32(_mm_srli_si128(sum, 4));
}